

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_test.cc
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_862632::AddAuthorityKeyIdentifier
          (anon_unknown_dwarf_862632 *this,X509_CRL *crl,Span<const_unsigned_char> key_id)

{
  int iVar1;
  ASN1_OCTET_STRING *pAVar2;
  bool bVar3;
  UniquePtr<AUTHORITY_KEYID> akid;
  
  akid._M_t.super___uniq_ptr_impl<AUTHORITY_KEYID_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_AUTHORITY_KEYID_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_AUTHORITY_KEYID_st_*,_false>._M_head_impl =
       (__uniq_ptr_data<AUTHORITY_KEYID_st,_bssl::internal::Deleter,_true,_true>)
       AUTHORITY_KEYID_new();
  if ((tuple<AUTHORITY_KEYID_st_*,_bssl::internal::Deleter>)
      akid._M_t.super___uniq_ptr_impl<AUTHORITY_KEYID_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_AUTHORITY_KEYID_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_AUTHORITY_KEYID_st_*,_false>._M_head_impl !=
      (_Head_base<0UL,_AUTHORITY_KEYID_st_*,_false>)0x0) {
    pAVar2 = ASN1_OCTET_STRING_new();
    *(ASN1_OCTET_STRING **)
     akid._M_t.super___uniq_ptr_impl<AUTHORITY_KEYID_st,_bssl::internal::Deleter>._M_t.
     super__Tuple_impl<0UL,_AUTHORITY_KEYID_st_*,_bssl::internal::Deleter>.
     super__Head_base<0UL,_AUTHORITY_KEYID_st_*,_false>._M_head_impl = pAVar2;
    if (*(ASN1_STRING **)
         akid._M_t.super___uniq_ptr_impl<AUTHORITY_KEYID_st,_bssl::internal::Deleter>._M_t.
         super__Tuple_impl<0UL,_AUTHORITY_KEYID_st_*,_bssl::internal::Deleter>.
         super__Head_base<0UL,_AUTHORITY_KEYID_st_*,_false>._M_head_impl != (ASN1_STRING *)0x0) {
      iVar1 = ASN1_STRING_set(*(ASN1_STRING **)
                               akid._M_t.
                               super___uniq_ptr_impl<AUTHORITY_KEYID_st,_bssl::internal::Deleter>.
                               _M_t.
                               super__Tuple_impl<0UL,_AUTHORITY_KEYID_st_*,_bssl::internal::Deleter>
                               .super__Head_base<0UL,_AUTHORITY_KEYID_st_*,_false>._M_head_impl,crl,
                              (int)key_id.data_);
      if (iVar1 != 0) {
        iVar1 = X509_CRL_add1_ext_i2d
                          ((X509_CRL *)this,0x5a,
                           (void *)akid._M_t.
                                   super___uniq_ptr_impl<AUTHORITY_KEYID_st,_bssl::internal::Deleter>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_AUTHORITY_KEYID_st_*,_bssl::internal::Deleter>
                                   .super__Head_base<0UL,_AUTHORITY_KEYID_st_*,_false>._M_head_impl,
                           0,0);
        bVar3 = iVar1 != 0;
        goto LAB_0039c859;
      }
    }
  }
  bVar3 = false;
LAB_0039c859:
  std::unique_ptr<AUTHORITY_KEYID_st,_bssl::internal::Deleter>::~unique_ptr(&akid);
  return bVar3;
}

Assistant:

static bool AddAuthorityKeyIdentifier(X509_CRL *crl,
                                      bssl::Span<const uint8_t> key_id) {
  bssl::UniquePtr<AUTHORITY_KEYID> akid(AUTHORITY_KEYID_new());
  if (akid == nullptr) {
    return false;
  }
  akid->keyid = ASN1_OCTET_STRING_new();
  if (akid->keyid == nullptr ||
      !ASN1_STRING_set(akid->keyid, key_id.data(), key_id.size()) ||
      !X509_CRL_add1_ext_i2d(crl, NID_authority_key_identifier, akid.get(),
                             /*crit=*/0, /*flags=*/0)) {
    return false;
  }
  return true;
}